

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double find_split_full_gain<float,long_double>
                 (float *x,size_t st,size_t end,size_t *ix_arr,size_t *cols_use,size_t ncols_use,
                 bool force_cols_use,double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,
                 size_t *Xr_indptr,double *buffer_sum_left,double *buffer_sum_tot,size_t *split_ix,
                 double *split_point,bool x_uses_ix_arr)

{
  ulong *puVar1;
  ulong *puVar2;
  double dVar3;
  size_t sVar4;
  ulong uVar5;
  size_t row;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  ulong *puVar9;
  size_t sVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  size_t *cols_end;
  long lVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  size_t local_60;
  
  if (end < st || end - st == 0) {
    return -INFINITY;
  }
  uVar6 = st;
  if ((ncols_use == 0 || cols_use == (size_t *)0x0) ||
     (auVar26._8_4_ = (int)(ncols_use >> 0x20), auVar26._0_8_ = ncols_use,
     auVar26._12_4_ = 0x45300000, auVar17._8_4_ = (int)(ncols >> 0x20), auVar17._0_8_ = ncols,
     auVar17._12_4_ = 0x45300000,
     0.1 <= ((auVar26._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)ncols_use) - 4503599627370496.0)) /
            ((auVar17._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)ncols) - 4503599627370496.0)))) {
    sVar7 = ncols;
    if (force_cols_use) {
      sVar7 = ncols_use;
    }
    local_60 = sVar7 << 3;
    memset(buffer_sum_tot,0,local_60);
    if (Xr_indptr != (size_t *)0x0) {
      if (!force_cols_use) {
        do {
          sVar8 = Xr_indptr[ix_arr[uVar6] + 1];
          for (sVar7 = Xr_indptr[ix_arr[uVar6]]; sVar8 != sVar7; sVar7 = sVar7 + 1) {
            buffer_sum_tot[Xr_ind[sVar7]] = Xr[sVar7] + buffer_sum_tot[Xr_ind[sVar7]];
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 <= end);
        memset(buffer_sum_left,0,local_60);
        dVar29 = -INFINITY;
        sVar7 = st;
        do {
          sVar8 = ix_arr[sVar7];
          sVar4 = Xr_indptr[sVar8 + 1];
          for (sVar10 = Xr_indptr[sVar8]; sVar4 != sVar10; sVar10 = sVar10 + 1) {
            buffer_sum_left[Xr_ind[sVar10]] = Xr[sVar10] + buffer_sum_left[Xr_ind[sVar10]];
          }
          if (x_uses_ix_arr) {
            bVar15 = NAN(x[sVar8]) || NAN(x[ix_arr[sVar7 + 1]]);
            bVar16 = x[sVar8] == x[ix_arr[sVar7 + 1]];
          }
          else {
            bVar15 = NAN(x[sVar7]) || NAN(x[sVar7 + 1]);
            bVar16 = x[sVar7] == x[sVar7 + 1];
          }
          if ((!bVar16) || (bVar15)) {
            uVar6 = (sVar7 - st) + 1;
            if (ncols == 0) {
              dVar23 = 0.0;
            }
            else {
              auVar20._0_8_ =
                   (double)(end - sVar7 & 0xffffffff | 0x4330000000000000) +
                   ((double)(end - sVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
              auVar20._8_8_ =
                   (double)(uVar6 & 0xffffffff | 0x4330000000000000) +
                   ((double)(uVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
              dVar22 = 0.0;
              dVar23 = 0.0;
              sVar8 = 0;
              do {
                dVar3 = buffer_sum_left[sVar8];
                auVar27._8_8_ = dVar3;
                auVar27._0_8_ = buffer_sum_tot[sVar8] - dVar3;
                auVar26 = divpd(auVar27,auVar20);
                dVar22 = dVar22 + auVar26._0_8_ * (buffer_sum_tot[sVar8] - dVar3);
                dVar23 = dVar23 + auVar26._8_8_ * dVar3;
                sVar8 = sVar8 + 1;
              } while (ncols != sVar8);
              dVar23 = dVar23 + dVar22;
            }
            if (dVar29 < dVar23) {
              *split_ix = sVar7;
              dVar29 = dVar23;
            }
          }
          sVar7 = sVar7 + 1;
        } while (sVar7 != end);
        goto LAB_0028bea6;
      }
      goto LAB_0028b611;
    }
    if (!force_cols_use) {
      do {
        if (ncols != 0) {
          sVar7 = ix_arr[uVar6];
          sVar8 = 0;
          do {
            buffer_sum_tot[sVar8] = X_row_major[sVar7 * ncols + sVar8] + buffer_sum_tot[sVar8];
            sVar8 = sVar8 + 1;
          } while (ncols != sVar8);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 <= end);
      memset(buffer_sum_left,0,local_60);
      dVar29 = -INFINITY;
      sVar7 = st;
      do {
        sVar8 = ix_arr[sVar7];
        if (ncols != 0) {
          sVar10 = 0;
          do {
            buffer_sum_left[sVar10] = X_row_major[sVar8 * ncols + sVar10] + buffer_sum_left[sVar10];
            sVar10 = sVar10 + 1;
          } while (ncols != sVar10);
        }
        if (x_uses_ix_arr) {
          bVar15 = NAN(x[sVar8]) || NAN(x[ix_arr[sVar7 + 1]]);
          bVar16 = x[sVar8] == x[ix_arr[sVar7 + 1]];
        }
        else {
          bVar15 = NAN(x[sVar7]) || NAN(x[sVar7 + 1]);
          bVar16 = x[sVar7] == x[sVar7 + 1];
        }
        if ((!bVar16) || (bVar15)) {
          uVar6 = (sVar7 - st) + 1;
          if (ncols == 0) {
            dVar23 = 0.0;
          }
          else {
            auVar21._0_8_ =
                 (double)(end - sVar7 & 0xffffffff | 0x4330000000000000) +
                 ((double)(end - sVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
            auVar21._8_8_ =
                 (double)(uVar6 & 0xffffffff | 0x4330000000000000) +
                 ((double)(uVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
            dVar22 = 0.0;
            dVar23 = 0.0;
            sVar8 = 0;
            do {
              dVar3 = buffer_sum_left[sVar8];
              auVar28._8_8_ = dVar3;
              auVar28._0_8_ = buffer_sum_tot[sVar8] - dVar3;
              auVar26 = divpd(auVar28,auVar21);
              dVar22 = dVar22 + auVar26._0_8_ * (buffer_sum_tot[sVar8] - dVar3);
              dVar23 = dVar23 + auVar26._8_8_ * dVar3;
              sVar8 = sVar8 + 1;
            } while (ncols != sVar8);
            dVar23 = dVar23 + dVar22;
          }
          if (dVar29 < dVar23) {
            *split_ix = sVar7;
            dVar29 = dVar23;
          }
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != end);
      goto LAB_0028bea6;
    }
  }
  else {
    local_60 = ncols_use * 8;
    memset(buffer_sum_tot,0,local_60);
    if (Xr_indptr != (size_t *)0x0) {
LAB_0028b611:
      puVar1 = cols_use + ncols_use;
      sVar7 = st;
      do {
        sVar8 = Xr_indptr[ix_arr[sVar7]];
        sVar10 = Xr_indptr[ix_arr[sVar7] + 1];
        if (((sVar8 != sVar10) && (0 < (long)ncols_use)) && ((long)sVar8 < (long)sVar10)) {
          puVar2 = Xr_ind + sVar10;
          puVar9 = Xr_ind + sVar8;
          puVar11 = cols_use;
          do {
            uVar6 = *puVar9;
            uVar5 = *puVar11;
            if (uVar6 == uVar5) {
              *(double *)((long)buffer_sum_tot + ((long)puVar11 - (long)cols_use)) =
                   *(double *)((long)Xr + (long)puVar2 + (sVar8 * 8 - (long)puVar9)) +
                   *(double *)((long)buffer_sum_tot + ((long)puVar11 - (long)cols_use));
              puVar11 = puVar11 + 1;
              puVar9 = puVar9 + 1;
            }
            else if (uVar5 < uVar6) {
              uVar5 = (long)puVar1 - (long)puVar11 >> 3;
              while (0 < (long)uVar5) {
                uVar12 = uVar5 >> 1;
                uVar13 = ~uVar12 + uVar5;
                uVar5 = uVar12;
                if (puVar11[uVar12] < uVar6) {
                  uVar5 = uVar13;
                  puVar11 = puVar11 + uVar12 + 1;
                }
              }
            }
            else {
              uVar6 = (long)puVar2 - (long)puVar9 >> 3;
              while (0 < (long)uVar6) {
                uVar12 = uVar6 >> 1;
                uVar13 = ~uVar12 + uVar6;
                uVar6 = uVar12;
                if (puVar9[uVar12] < uVar5) {
                  uVar6 = uVar13;
                  puVar9 = puVar9 + uVar12 + 1;
                }
              }
            }
          } while ((puVar11 < puVar1) && (puVar9 < puVar2));
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 <= end);
      memset(buffer_sum_left,0,local_60);
      dVar29 = -INFINITY;
      sVar7 = st;
      do {
        sVar8 = ix_arr[sVar7];
        sVar10 = Xr_indptr[sVar8];
        sVar4 = Xr_indptr[sVar8 + 1];
        if (((sVar10 != sVar4) && (0 < (long)ncols_use)) && ((long)sVar10 < (long)sVar4)) {
          puVar2 = Xr_ind + sVar4;
          puVar9 = Xr_ind + sVar10;
          puVar11 = cols_use;
          do {
            uVar6 = *puVar9;
            uVar5 = *puVar11;
            if (uVar6 == uVar5) {
              *(double *)((long)buffer_sum_left + ((long)puVar11 - (long)cols_use)) =
                   *(double *)((long)Xr + (long)puVar2 + (sVar10 * 8 - (long)puVar9)) +
                   *(double *)((long)buffer_sum_left + ((long)puVar11 - (long)cols_use));
              puVar11 = puVar11 + 1;
              puVar9 = puVar9 + 1;
            }
            else if (uVar5 < uVar6) {
              uVar5 = (long)puVar1 - (long)puVar11 >> 3;
              while (0 < (long)uVar5) {
                uVar12 = uVar5 >> 1;
                uVar13 = ~uVar12 + uVar5;
                uVar5 = uVar12;
                if (puVar11[uVar12] < uVar6) {
                  uVar5 = uVar13;
                  puVar11 = puVar11 + uVar12 + 1;
                }
              }
            }
            else {
              uVar6 = (long)puVar2 - (long)puVar9 >> 3;
              while (0 < (long)uVar6) {
                uVar12 = uVar6 >> 1;
                uVar13 = ~uVar12 + uVar6;
                uVar6 = uVar12;
                if (puVar9[uVar12] < uVar5) {
                  uVar6 = uVar13;
                  puVar9 = puVar9 + uVar12 + 1;
                }
              }
            }
          } while ((puVar11 < puVar1) && (puVar9 < puVar2));
        }
        if (x_uses_ix_arr) {
          bVar15 = NAN(x[sVar8]) || NAN(x[ix_arr[sVar7 + 1]]);
          bVar16 = x[sVar8] == x[ix_arr[sVar7 + 1]];
        }
        else {
          bVar15 = NAN(x[sVar7]) || NAN(x[sVar7 + 1]);
          bVar16 = x[sVar7] == x[sVar7 + 1];
        }
        if ((!bVar16) || (bVar15)) {
          uVar6 = (sVar7 - st) + 1;
          if (ncols_use == 0) {
            dVar23 = 0.0;
          }
          else {
            auVar18._0_8_ =
                 (double)(end - sVar7 & 0xffffffff | 0x4330000000000000) +
                 ((double)(end - sVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
            auVar18._8_8_ =
                 (double)(uVar6 & 0xffffffff | 0x4330000000000000) +
                 ((double)(uVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
            dVar22 = 0.0;
            dVar23 = 0.0;
            sVar8 = 0;
            do {
              dVar3 = buffer_sum_left[sVar8];
              auVar24._8_8_ = dVar3;
              auVar24._0_8_ = buffer_sum_tot[sVar8] - dVar3;
              auVar26 = divpd(auVar24,auVar18);
              dVar22 = dVar22 + auVar26._0_8_ * (buffer_sum_tot[sVar8] - dVar3);
              dVar23 = dVar23 + auVar26._8_8_ * dVar3;
              sVar8 = sVar8 + 1;
            } while (ncols_use != sVar8);
            dVar23 = dVar23 + dVar22;
          }
          if (dVar29 < dVar23) {
            *split_ix = sVar7;
            dVar29 = dVar23;
          }
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != end);
      goto LAB_0028bea6;
    }
  }
  do {
    if (ncols_use != 0) {
      sVar7 = ix_arr[uVar6];
      sVar8 = 0;
      do {
        buffer_sum_tot[sVar8] = X_row_major[sVar7 * ncols + cols_use[sVar8]] + buffer_sum_tot[sVar8]
        ;
        sVar8 = sVar8 + 1;
      } while (ncols_use != sVar8);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 <= end);
  memset(buffer_sum_left,0,local_60);
  dVar29 = -INFINITY;
  sVar7 = st;
  do {
    sVar8 = ix_arr[sVar7];
    if (ncols_use != 0) {
      sVar10 = 0;
      do {
        buffer_sum_left[sVar10] =
             X_row_major[sVar8 * ncols + cols_use[sVar10]] + buffer_sum_left[sVar10];
        sVar10 = sVar10 + 1;
      } while (ncols_use != sVar10);
    }
    if (x_uses_ix_arr) {
      bVar15 = NAN(x[sVar8]) || NAN(x[ix_arr[sVar7 + 1]]);
      bVar16 = x[sVar8] == x[ix_arr[sVar7 + 1]];
    }
    else {
      bVar15 = NAN(x[sVar7]) || NAN(x[sVar7 + 1]);
      bVar16 = x[sVar7] == x[sVar7 + 1];
    }
    if ((!bVar16) || (bVar15)) {
      uVar6 = (sVar7 - st) + 1;
      if (ncols_use == 0) {
        dVar23 = 0.0;
      }
      else {
        auVar19._0_8_ =
             (double)(end - sVar7 & 0xffffffff | 0x4330000000000000) +
             ((double)(end - sVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
        auVar19._8_8_ =
             (double)(uVar6 & 0xffffffff | 0x4330000000000000) +
             ((double)(uVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
        dVar22 = 0.0;
        dVar23 = 0.0;
        sVar8 = 0;
        do {
          dVar3 = buffer_sum_left[sVar8];
          auVar25._8_8_ = dVar3;
          auVar25._0_8_ = buffer_sum_tot[sVar8] - dVar3;
          auVar26 = divpd(auVar25,auVar19);
          dVar22 = dVar22 + auVar26._0_8_ * (buffer_sum_tot[sVar8] - dVar3);
          dVar23 = dVar23 + auVar26._8_8_ * dVar3;
          sVar8 = sVar8 + 1;
        } while (ncols_use != sVar8);
        dVar23 = dVar23 + dVar22;
      }
      if (dVar29 < dVar23) {
        *split_ix = sVar7;
        dVar29 = dVar23;
      }
    }
    sVar7 = sVar7 + 1;
  } while (sVar7 != end);
LAB_0028bea6:
  dVar23 = -INFINITY;
  if (-INFINITY < dVar29) {
    sVar7 = *split_ix;
    if (x_uses_ix_arr) {
      sVar8 = ix_arr[sVar7 + 1];
      sVar7 = ix_arr[sVar7];
    }
    else {
      sVar8 = sVar7 + 1;
    }
    dVar23 = midpoint<float>(x[sVar7],x[sVar8]);
    *split_point = dVar23;
    lVar14 = (end - st) + 1;
    dVar23 = (double)((float)dVar29 / ((float)lVar14 + (float)(&DAT_0036e0d8)[lVar14 < 0]));
  }
  return dVar23;
}

Assistant:

double find_split_full_gain(real_t *restrict x, size_t st, size_t end, size_t *restrict ix_arr,
                            size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                            double *restrict X_row_major, size_t ncols,
                            double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                            double *restrict buffer_sum_left, double *restrict buffer_sum_tot,
                            size_t &restrict split_ix, double &restrict split_point,
                            bool x_uses_ix_arr)
{
    if (end <= st) return -HUGE_VAL;
    if (cols_use != NULL && ncols_use && (double)ncols_use / (double)ncols < 0.1)
        force_cols_use = true;

    memset(buffer_sum_tot, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (force_cols_use)
        {
            double *restrict ptr_row;
            for (size_t row = st; row <= end; row++)
            {
                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_tot[col] += ptr_row[cols_use[col]];
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
                xpy1(X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
        }
    }

    else
    {
        if (force_cols_use)
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            for (size_t row = st; row <= end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) continue;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        buffer_sum_tot[std::distance(cols_use, curr_col)] += Xr_this[std::distance(curr_begin, row_end)];
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }
            }
        }

        else
        {
            size_t ptr_this;
            for (size_t row = st; row <= end; row++)
            {
                ptr_this = Xr_indptr[ix_arr[row]];
                xpy1(Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
            }
        }
    }

    double best_gain = -HUGE_VAL;
    double this_gain;
    double sl, sr;
    double dl, dr;
    double vleft, vright;
    memset(buffer_sum_left, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            for (size_t row = st; row < end; row++)
            {
                xpy1(X_row_major + ix_arr[row]*ncols, buffer_sum_left, ncols);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            double *restrict ptr_row;
            for (size_t row = st; row < end; row++)
            {
                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_left[col] += ptr_row[cols_use[col]];
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            for (size_t row = st; row < end; row++)
            {
                ptr_this = Xr_indptr[ix_arr[row]];
                xpy1(Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_left);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            for (size_t row = st; row < end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) goto skip_sum;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        buffer_sum_left[std::distance(cols_use, curr_col)] += Xr_this[std::distance(curr_begin, row_end)];
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }

                skip_sum:
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    if (best_gain <= -HUGE_VAL) return best_gain;

    if (x_uses_ix_arr)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    else
        split_point = midpoint(x[split_ix], x[split_ix+1]);
    return best_gain / (ldouble_safe)(end - st + 1);
}